

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O1

void __thiscall
Rml::DecoratorText::RenderElement
          (DecoratorText *this,Element *element,DecoratorDataHandle element_data)

{
  Vector2f VVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Texture texture;
  CompiledShader local_48;
  undefined1 local_38 [16];
  
  bVar2 = GenerateGeometry(this,element,(ElementData *)element_data);
  if (bVar2) {
    VVar1 = Element::GetAbsoluteOffset(element,Border);
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._0_4_ = VVar1.x;
    local_38._4_4_ = VVar1.y;
    local_38._12_4_ = extraout_XMM0_Dd;
    lVar3 = *(long *)(element_data + 8);
    if (*(long *)(element_data + 0x10) != lVar3) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        local_48.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager
             = (RenderManager *)0x0;
        local_48.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle
             = 0;
        texture._8_8_ = *(undefined8 *)(lVar3 + 0x18 + lVar5);
        texture.render_manager = *(RenderManager **)(lVar3 + 0x10 + lVar5);
        Geometry::Render((Geometry *)(lVar3 + lVar5),(Vector2f)local_38._0_8_,texture,&local_48);
        CompiledShader::Release(&local_48);
        uVar4 = uVar4 + 1;
        lVar3 = *(long *)(element_data + 8);
        lVar5 = lVar5 + 0x20;
      } while (uVar4 < (ulong)(*(long *)(element_data + 0x10) - lVar3 >> 5));
    }
  }
  return;
}

Assistant:

void DecoratorText::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	ElementData* data = reinterpret_cast<ElementData*>(element_data);
	if (!GenerateGeometry(element, *data))
		return;

	const Vector2f translation = element->GetAbsoluteOffset(BoxArea::Border);

	for (size_t i = 0; i < data->textured_geometry.size(); ++i)
		data->textured_geometry[i].geometry.Render(translation, data->textured_geometry[i].texture);
}